

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmder.c
# Opt level: O2

int lmder(cminpack_funcder_mn fcnder_mn,void *p,int m,int n,double *x,double *fvec,double *fjac,
         int ldfjac,double ftol,double xtol,double gtol,int maxfev,double *diag,int mode,
         double factor,int nprint,int *nfev,int *njev,int *ipvt,double *qtf,double *wa1,double *wa2,
         double *wa3,double *wa4)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  double *pdVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  ulong extraout_XMM0_Qb_03;
  double dVar19;
  double dVar20;
  ulong uVar21;
  double dVar22;
  double par;
  ulong local_138;
  void *local_130;
  cminpack_funcder_mn local_128;
  double *local_120;
  double local_118;
  ulong uStack_110;
  ulong local_100;
  double local_f8;
  ulong uStack_f0;
  double local_e0;
  long local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  ulong uStack_b0;
  double local_a8;
  ulong uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_80;
  double local_78;
  double local_70;
  long local_68;
  long local_60;
  double local_58;
  double local_48;
  ulong uStack_40;
  
  uVar9 = (ulong)(uint)n;
  local_130 = p;
  local_128 = fcnder_mn;
  local_120 = x;
  local_d0 = factor;
  local_c8 = gtol;
  local_c0 = xtol;
  local_58 = ftol;
  dVar14 = dpmpar(1);
  pdVar12 = local_120;
  *nfev = 0;
  *njev = 0;
  uVar3 = 0;
  uVar11 = 0;
  if (((((n <= m && 0 < n) && (m <= ldfjac)) && (uVar3 = uVar11, 0.0 <= local_58)) &&
      ((0.0 <= local_c0 && (0.0 <= local_c8)))) && ((uVar3 = 0, 0 < maxfev && (0.0 < local_d0)))) {
    if (mode == 2) {
      uVar21 = 0;
      do {
        if (uVar9 == uVar21) goto LAB_0010181a;
        pdVar5 = diag + uVar21;
        uVar21 = uVar21 + 1;
      } while (0.0 < *pdVar5);
      uVar3 = 0;
    }
    else {
LAB_0010181a:
      local_78 = dVar14;
      uVar3 = (*local_128)(local_130,m,n,local_120,fvec,fjac,ldfjac,1);
      *nfev = 1;
      if (-1 < (int)uVar3) {
        local_118 = enorm(m,fvec);
        par = 0.0;
        local_60 = (long)ldfjac;
        local_100 = (ulong)(uint)m;
        local_d8 = local_60 * 8;
        local_68 = local_60 * 8 + 8;
        local_138 = 1;
        dVar14 = 0.0;
        uVar21 = 0;
        local_e0 = 0.0;
        uStack_110 = extraout_XMM0_Qb;
        while( true ) {
          local_f8 = dVar14;
          uStack_f0 = uVar21;
          uVar3 = (*local_128)(local_130,m,n,pdVar12,fvec,fjac,ldfjac,2);
          *njev = *njev + 1;
          if ((int)uVar3 < 0) break;
          if (((0 < nprint) && (((int)local_138 + -1) % nprint == 0)) &&
             (uVar3 = (*local_128)(local_130,m,n,pdVar12,fvec,fjac,ldfjac,0), (int)uVar3 < 0))
          goto LAB_00101758;
          qrfac(m,n,fjac,ldfjac,1,ipvt,n,wa1,wa2,wa3);
          dVar14 = local_f8;
          uVar21 = uStack_f0;
          if ((int)local_138 == 1) {
            if (mode != 2) {
              for (uVar21 = 0; uVar9 != uVar21; uVar21 = uVar21 + 1) {
                uVar4 = -(ulong)(wa2[uVar21] == 0.0);
                diag[uVar21] = (double)(uVar4 & 0x3ff0000000000000 | ~uVar4 & (ulong)wa2[uVar21]);
              }
            }
            for (uVar21 = 0; uVar9 != uVar21; uVar21 = uVar21 + 1) {
              wa3[uVar21] = diag[uVar21] * pdVar12[uVar21];
            }
            local_e0 = enorm(n,wa3);
            dVar14 = local_e0 * local_d0;
            uVar21 = extraout_XMM0_Qb_00;
            if ((dVar14 == 0.0) && (!NAN(dVar14))) {
              uVar21 = 0;
              dVar14 = local_d0;
            }
          }
          for (uVar4 = 0; local_100 != uVar4; uVar4 = uVar4 + 1) {
            wa4[uVar4] = fvec[uVar4];
          }
          lVar7 = 0;
          uVar4 = 0;
          pdVar5 = wa4;
          pdVar8 = fjac;
          while( true ) {
            uVar13 = uVar4 & 0xffffffff;
            if ((int)uVar4 < m) {
              uVar13 = (ulong)(uint)m;
            }
            if (uVar4 == uVar9) break;
            dVar20 = fjac[uVar4 * local_60 + uVar4];
            if ((dVar20 != 0.0) || (NAN(dVar20))) {
              dVar15 = 0.0;
              for (lVar10 = 0; uVar13 + lVar7 != lVar10; lVar10 = lVar10 + 1) {
                dVar15 = dVar15 + pdVar8[lVar10] * pdVar5[lVar10];
              }
              for (lVar10 = 0; uVar13 + lVar7 != lVar10; lVar10 = lVar10 + 1) {
                pdVar5[lVar10] = pdVar8[lVar10] * (-dVar15 / dVar20) + pdVar5[lVar10];
              }
            }
            fjac[uVar4 * local_60 + uVar4] = wa1[uVar4];
            qtf[uVar4] = wa4[uVar4];
            uVar4 = uVar4 + 1;
            pdVar8 = (double *)((long)pdVar8 + local_68);
            lVar7 = lVar7 + -1;
            pdVar5 = pdVar5 + 1;
          }
          dVar20 = 0.0;
          if ((local_118 != 0.0) || (NAN(local_118))) {
            lVar7 = 1;
            pdVar5 = fjac;
            for (uVar4 = 0; uVar4 != uVar9; uVar4 = uVar4 + 1) {
              dVar15 = wa2[(long)ipvt[uVar4] + -1];
              if ((dVar15 != 0.0) || (NAN(dVar15))) {
                dVar16 = 0.0;
                for (lVar10 = 0; lVar7 != lVar10; lVar10 = lVar10 + 1) {
                  dVar16 = dVar16 + (qtf[lVar10] / local_118) * pdVar5[lVar10];
                }
                uVar13 = -(ulong)(ABS(dVar16 / dVar15) <= dVar20);
                dVar20 = (double)(uVar13 & (ulong)dVar20 | ~uVar13 & (ulong)ABS(dVar16 / dVar15));
              }
              lVar7 = lVar7 + 1;
              pdVar5 = (double *)((long)pdVar5 + local_d8);
            }
          }
          if (dVar20 <= local_c8) {
            uVar3 = 4;
            break;
          }
          if (mode != 2) {
            for (uVar4 = 0; uVar9 != uVar4; uVar4 = uVar4 + 1) {
              uVar13 = -(ulong)(wa2[uVar4] <= diag[uVar4]);
              diag[uVar4] = (double)(~uVar13 & (ulong)wa2[uVar4] | (ulong)diag[uVar4] & uVar13);
            }
          }
          uStack_90 = 0;
          local_98 = dVar20;
          do {
            local_f8 = dVar14;
            uStack_f0 = uVar21;
            lmpar(n,fjac,ldfjac,ipvt,diag,qtf,dVar14,&par,wa1,wa2,wa3,wa4);
            for (uVar21 = 0; uVar9 != uVar21; uVar21 = uVar21 + 1) {
              dVar14 = wa1[uVar21];
              wa1[uVar21] = -dVar14;
              wa2[uVar21] = pdVar12[uVar21] - dVar14;
              wa3[uVar21] = diag[uVar21] * wa1[uVar21];
            }
            local_a8 = enorm(n,wa3);
            if ((int)local_138 == 1) {
              local_f8 = (double)(-(ulong)(local_f8 <= local_a8) & (ulong)local_f8 |
                                 ~-(ulong)(local_f8 <= local_a8) & (ulong)local_a8);
              uStack_f0 = uStack_f0 | ~uStack_f0 & extraout_XMM0_Qb_01;
            }
            uStack_a0 = extraout_XMM0_Qb_01;
            uVar3 = (*local_128)(local_130,m,n,wa2,wa4,fjac,ldfjac,1);
            *nfev = *nfev + 1;
            pdVar12 = local_120;
            if ((int)uVar3 < 0) goto LAB_0010174e;
            local_70 = enorm(m,wa4);
            pdVar12 = local_120;
            local_b8 = local_70 * 0.1;
            local_48 = 1.0 - (local_70 / local_118) * (local_70 / local_118);
            uStack_40 = 0;
            lVar7 = 1;
            pdVar5 = fjac;
            for (uVar21 = 0; uVar21 != uVar9; uVar21 = uVar21 + 1) {
              wa3[uVar21] = 0.0;
              dVar14 = wa1[(long)ipvt[uVar21] + -1];
              for (lVar10 = 0; lVar7 != lVar10; lVar10 = lVar10 + 1) {
                wa3[lVar10] = pdVar5[lVar10] * dVar14 + wa3[lVar10];
              }
              lVar7 = lVar7 + 1;
              pdVar5 = (double *)((long)pdVar5 + local_d8);
            }
            uStack_b0 = extraout_XMM0_Qb_02;
            dVar14 = enorm(n,wa3);
            if (par < 0.0) {
              local_80 = dVar14;
              dVar20 = sqrt(par);
              dVar14 = local_80;
              uVar4 = extraout_XMM0_Qb_03;
            }
            else {
              dVar20 = SQRT(par);
              uVar4 = 0;
            }
            dVar16 = (double)-(ulong)(local_b8 < local_118);
            uVar13 = uStack_b0 & uStack_40;
            dVar18 = (double)(~(ulong)dVar16 & 0xbff0000000000000 | (ulong)dVar16 & (ulong)local_48)
            ;
            dVar17 = (dVar20 * local_a8) / local_118;
            dVar17 = dVar17 * dVar17;
            dVar14 = (dVar14 / local_118) * (dVar14 / local_118);
            dVar15 = dVar17 + dVar17 + dVar14;
            dVar20 = (double)(-(ulong)(dVar15 != 0.0) & (ulong)(dVar18 / dVar15));
            if (dVar20 <= 0.25) {
              dVar14 = dVar14 + dVar17;
              dVar14 = (double)(~-(ulong)(dVar18 < 0.0) & 0x3fe0000000000000 |
                               (ulong)((dVar14 * -0.5) / (dVar18 * 0.5 - dVar14)) &
                               -(ulong)(dVar18 < 0.0));
              dVar17 = 0.1;
              if (local_b8 < local_118 && 0.1 <= dVar14) {
                dVar17 = dVar14;
              }
              uVar6 = -(ulong)(local_f8 <= local_a8 / 0.1);
              uVar21 = uStack_f0 | ~uStack_f0 & uStack_a0;
              dVar14 = (double)(uVar6 & (ulong)local_f8 | ~uVar6 & (ulong)(local_a8 / 0.1)) * dVar17
              ;
              par = par / dVar17;
            }
            else if ((0.75 <= dVar20) ||
                    ((dVar14 = local_f8, uVar21 = uStack_f0, par == 0.0 && (!NAN(par))))) {
              dVar14 = local_a8 + local_a8;
              par = par * 0.5;
              uVar21 = uStack_a0;
            }
            dVar17 = local_118;
            uVar6 = uStack_110;
            dVar18 = local_e0;
            if (0.0001 <= dVar20) {
              for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
                dVar17 = wa2[uVar6];
                pdVar12[uVar6] = dVar17;
                wa2[uVar6] = dVar17 * diag[uVar6];
              }
              for (uVar6 = 0; local_100 != uVar6; uVar6 = uVar6 + 1) {
                fvec[uVar6] = wa4[uVar6];
              }
              uStack_110 = uStack_b0;
              local_118 = dVar16;
              local_f8 = dVar14;
              uStack_f0 = uVar21;
              local_b8 = dVar15;
              uStack_b0 = uVar4;
              local_a8 = dVar20;
              uStack_a0 = uVar4 & uVar13;
              dVar18 = enorm(n,wa2);
              local_138 = (ulong)((int)local_138 + 1);
              dVar17 = local_70;
              uVar6 = 0;
              dVar14 = local_f8;
              uVar21 = uStack_f0;
              dVar20 = local_a8;
              dVar15 = local_b8;
              dVar16 = local_118;
            }
            dVar22 = (double)(~(ulong)dVar16 & 0x3ff0000000000000 |
                             (ulong)ABS(local_48) & (ulong)dVar16);
            bVar1 = local_58 < dVar22;
            bVar2 = local_58 < dVar15;
            dVar16 = dVar20 * 0.5;
            dVar19 = dVar18 * local_c0;
            if (((!bVar2 && !bVar1) && (dVar16 <= 1.0)) && (dVar14 <= dVar19)) {
              uVar3 = 3;
              goto LAB_0010174e;
            }
            if (((!bVar2 && !bVar1) && 1.0 >= dVar16) || (dVar14 <= dVar19)) {
              uVar3 = 2;
              if (dVar19 < dVar14) {
                uVar3 = (byte)~((bVar2 || bVar1) || 1.0 < dVar16) & 1;
              }
              goto LAB_0010174e;
            }
            uVar11 = (uint)(maxfev <= *nfev) * 5;
            uVar3 = 6;
            if (1.0 < dVar16) {
              uVar3 = uVar11;
            }
            if (local_78 < dVar15) {
              uVar3 = uVar11;
            }
            if (local_78 < dVar22) {
              uVar3 = uVar11;
            }
            if (dVar14 <= local_78 * dVar18) {
              uVar3 = 7;
            }
            if (local_98 <= local_78) {
              uVar3 = 8;
            }
            if (uVar3 != 0) goto LAB_0010174e;
            local_118 = dVar17;
            uStack_110 = uVar6;
            local_e0 = dVar18;
          } while (dVar20 < 0.0001);
        }
      }
    }
  }
LAB_0010174e:
  if (0 < nprint) {
LAB_00101758:
    (*local_128)(local_130,m,n,pdVar12,fvec,fjac,ldfjac,0);
  }
  return uVar3;
}

Assistant:

__cminpack_attr__
int __cminpack_func__(lmder)(__cminpack_decl_fcnder_mn__ void *p, int m, int n, real *x, 
	real *fvec, real *fjac, int ldfjac, real ftol,
	real xtol, real gtol, int maxfev, real *
	diag, int mode, real factor, int nprint,
	int *nfev, int *njev, int *ipvt, real *qtf, 
	real *wa1, real *wa2, real *wa3, real *wa4)
{
    /* Initialized data */

#define p1 ((real).1)
#define p5 ((real).5)
#define p25 ((real).25)
#define p75 .75
#define p0001 1e-4

    /* System generated locals */
    real d1, d2;

    /* Local variables */
    int i, j, l;
    real par, sum;
    int iter;
    real temp, temp1, temp2;
    int iflag;
    real delta = 0.;
    real ratio;
    real fnorm, gnorm, pnorm, xnorm = 0., fnorm1, actred, dirder, 
	    epsmch, prered;
    int info;

/*     ********** */

/*     subroutine lmder */

/*     the purpose of lmder is to minimize the sum of the squares of */
/*     m nonlinear functions in n variables by a modification of */
/*     the levenberg-marquardt algorithm. the user must provide a */
/*     subroutine which calculates the functions and the jacobian. */

/*     the subroutine statement is */

/*       subroutine lmder(fcn,m,n,x,fvec,fjac,ldfjac,ftol,xtol,gtol, */
/*                        maxfev,diag,mode,factor,nprint,info,nfev, */
/*                        njev,ipvt,qtf,wa1,wa2,wa3,wa4) */

/*     where */

/*       fcn is the name of the user-supplied subroutine which */
/*         calculates the functions and the jacobian. fcn must */
/*         be declared in an external statement in the user */
/*         calling program, and should be written as follows. */

/*         subroutine fcn(m,n,x,fvec,fjac,ldfjac,iflag) */
/*         integer m,n,ldfjac,iflag */
/*         double precision x(n),fvec(m),fjac(ldfjac,n) */
/*         ---------- */
/*         if iflag = 1 calculate the functions at x and */
/*         return this vector in fvec. do not alter fjac. */
/*         if iflag = 2 calculate the jacobian at x and */
/*         return this matrix in fjac. do not alter fvec. */
/*         ---------- */
/*         return */
/*         end */

/*         the value of iflag should not be changed by fcn unless */
/*         the user wants to terminate execution of lmder. */
/*         in this case set iflag to a negative integer. */

/*       m is a positive integer input variable set to the number */
/*         of functions. */

/*       n is a positive integer input variable set to the number */
/*         of variables. n must not exceed m. */

/*       x is an array of length n. on input x must contain */
/*         an initial estimate of the solution vector. on output x */
/*         contains the final estimate of the solution vector. */

/*       fvec is an output array of length m which contains */
/*         the functions evaluated at the output x. */

/*       fjac is an output m by n array. the upper n by n submatrix */
/*         of fjac contains an upper triangular matrix r with */
/*         diagonal elements of nonincreasing magnitude such that */

/*                t     t           t */
/*               p *(jac *jac)*p = r *r, */

/*         where p is a permutation matrix and jac is the final */
/*         calculated jacobian. column j of p is column ipvt(j) */
/*         (see below) of the identity matrix. the lower trapezoidal */
/*         part of fjac contains information generated during */
/*         the computation of r. */

/*       ldfjac is a positive integer input variable not less than m */
/*         which specifies the leading dimension of the array fjac. */

/*       ftol is a nonnegative input variable. termination */
/*         occurs when both the actual and predicted relative */
/*         reductions in the sum of squares are at most ftol. */
/*         therefore, ftol measures the relative error desired */
/*         in the sum of squares. */

/*       xtol is a nonnegative input variable. termination */
/*         occurs when the relative error between two consecutive */
/*         iterates is at most xtol. therefore, xtol measures the */
/*         relative error desired in the approximate solution. */

/*       gtol is a nonnegative input variable. termination */
/*         occurs when the cosine of the angle between fvec and */
/*         any column of the jacobian is at most gtol in absolute */
/*         value. therefore, gtol measures the orthogonality */
/*         desired between the function vector and the columns */
/*         of the jacobian. */

/*       maxfev is a positive integer input variable. termination */
/*         occurs when the number of calls to fcn with iflag = 1 */
/*         has reached maxfev. */

/*       diag is an array of length n. if mode = 1 (see */
/*         below), diag is internally set. if mode = 2, diag */
/*         must contain positive entries that serve as */
/*         multiplicative scale factors for the variables. */

/*       mode is an integer input variable. if mode = 1, the */
/*         variables will be scaled internally. if mode = 2, */
/*         the scaling is specified by the input diag. other */
/*         values of mode are equivalent to mode = 1. */

/*       factor is a positive input variable used in determining the */
/*         initial step bound. this bound is set to the product of */
/*         factor and the euclidean norm of diag*x if nonzero, or else */
/*         to factor itself. in most cases factor should lie in the */
/*         interval (.1,100.).100. is a generally recommended value. */

/*       nprint is an integer input variable that enables controlled */
/*         printing of iterates if it is positive. in this case, */
/*         fcn is called with iflag = 0 at the beginning of the first */
/*         iteration and every nprint iterations thereafter and */
/*         immediately prior to return, with x, fvec, and fjac */
/*         available for printing. fvec and fjac should not be */
/*         altered. if nprint is not positive, no special calls */
/*         of fcn with iflag = 0 are made. */

/*       info is an integer output variable. if the user has */
/*         terminated execution, info is set to the (negative) */
/*         value of iflag. see description of fcn. otherwise, */
/*         info is set as follows. */

/*         info = 0  improper input parameters. */

/*         info = 1  both actual and predicted relative reductions */
/*                   in the sum of squares are at most ftol. */

/*         info = 2  relative error between two consecutive iterates */
/*                   is at most xtol. */

/*         info = 3  conditions for info = 1 and info = 2 both hold. */

/*         info = 4  the cosine of the angle between fvec and any */
/*                   column of the jacobian is at most gtol in */
/*                   absolute value. */

/*         info = 5  number of calls to fcn with iflag = 1 has */
/*                   reached maxfev. */

/*         info = 6  ftol is too small. no further reduction in */
/*                   the sum of squares is possible. */

/*         info = 7  xtol is too small. no further improvement in */
/*                   the approximate solution x is possible. */

/*         info = 8  gtol is too small. fvec is orthogonal to the */
/*                   columns of the jacobian to machine precision. */

/*       nfev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 1. */

/*       njev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 2. */

/*       ipvt is an integer output array of length n. ipvt */
/*         defines a permutation matrix p such that jac*p = q*r, */
/*         where jac is the final calculated jacobian, q is */
/*         orthogonal (not stored), and r is upper triangular */
/*         with diagonal elements of nonincreasing magnitude. */
/*         column j of p is column ipvt(j) of the identity matrix. */

/*       qtf is an output array of length n which contains */
/*         the first n elements of the vector (q transpose)*fvec. */

/*       wa1, wa2, and wa3 are work arrays of length n. */

/*       wa4 is a work array of length m. */

/*     subprograms called */

/*       user-supplied ...... fcn */

/*       minpack-supplied ... dpmpar,enorm,lmpar,qrfac */

/*       fortran-supplied ... dabs,dmax1,dmin1,dsqrt,mod */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */

/*     epsmch is the machine precision. */

    epsmch = __cminpack_func__(dpmpar)(1);

    info = 0;
    iflag = 0;
    *nfev = 0;
    *njev = 0;

/*     check the input parameters for errors. */

    if (n <= 0 || m < n || ldfjac < m || ftol < 0. || xtol < 0. || 
	    gtol < 0. || maxfev <= 0 || factor <= 0.) {
	goto TERMINATE;
    }
    if (mode == 2) {
        for (j = 0; j < n; ++j) {
            if (diag[j] <= 0.) {
                goto TERMINATE;
            }
        }
    }

/*     evaluate the function at the starting point */
/*     and calculate its norm. */

    iflag = fcnder_mn(p, m, n, x, fvec, fjac, ldfjac, 1);
    *nfev = 1;
    if (iflag < 0) {
	goto TERMINATE;
    }
    fnorm = __cminpack_func__(enorm)(m, fvec);

/*     initialize levenberg-marquardt parameter and iteration counter. */

    par = 0.;
    iter = 1;

/*     beginning of the outer loop. */

    for (;;) {

/*        calculate the jacobian matrix. */

        iflag = fcnder_mn(p, m, n, x, fvec, fjac, ldfjac, 2);
        ++(*njev);
        if (iflag < 0) {
            goto TERMINATE;
        }

/*        if requested, call fcn to enable printing of iterates. */

        if (nprint > 0) {
            iflag = 0;
            if ((iter - 1) % nprint == 0) {
                iflag = fcnder_mn(p, m, n, x, fvec, fjac, ldfjac, 0);
            }
            if (iflag < 0) {
                goto TERMINATE;
            }
        }

/*        compute the qr factorization of the jacobian. */

        __cminpack_func__(qrfac)(m, n, fjac, ldfjac, TRUE_, ipvt, n,
              wa1, wa2, wa3);

/*        on the first iteration and if mode is 1, scale according */
/*        to the norms of the columns of the initial jacobian. */

        if (iter == 1) {
            if (mode != 2) {
                for (j = 0; j < n; ++j) {
                    diag[j] = wa2[j];
                    if (wa2[j] == 0.) {
                        diag[j] = 1.;
                    }
                }
            }

/*        on the first iteration, calculate the norm of the scaled x */
/*        and initialize the step bound delta. */

            for (j = 0; j < n; ++j) {
                wa3[j] = diag[j] * x[j];
            }
            xnorm = __cminpack_func__(enorm)(n, wa3);
            delta = factor * xnorm;
            if (delta == 0.) {
                delta = factor;
            }
        }

/*        form (q transpose)*fvec and store the first n components in */
/*        qtf. */

        for (i = 0; i < m; ++i) {
            wa4[i] = fvec[i];
        }
        for (j = 0; j < n; ++j) {
            if (fjac[j + j * ldfjac] != 0.) {
                sum = 0.;
                for (i = j; i < m; ++i) {
                    sum += fjac[i + j * ldfjac] * wa4[i];
                }
                temp = -sum / fjac[j + j * ldfjac];
                for (i = j; i < m; ++i) {
                    wa4[i] += fjac[i + j * ldfjac] * temp;
                }
            }
            fjac[j + j * ldfjac] = wa1[j];
            qtf[j] = wa4[j];
        }

/*        compute the norm of the scaled gradient. */

        gnorm = 0.;
        if (fnorm != 0.) {
            for (j = 0; j < n; ++j) {
                l = ipvt[j]-1;
                if (wa2[l] != 0.) {
                    sum = 0.;
                    for (i = 0; i <= j; ++i) {
                        sum += fjac[i + j * ldfjac] * (qtf[i] / fnorm);
                    }
                    /* Computing MAX */
                    d1 = fabs(sum / wa2[l]);
                    gnorm = max(gnorm,d1);
                }
            }
        }

/*        test for convergence of the gradient norm. */

        if (gnorm <= gtol) {
            info = 4;
        }
        if (info != 0) {
            goto TERMINATE;
        }

/*        rescale if necessary. */

        if (mode != 2) {
            for (j = 0; j < n; ++j) {
                /* Computing MAX */
                d1 = diag[j], d2 = wa2[j];
                diag[j] = max(d1,d2);
            }
        }

/*        beginning of the inner loop. */

        do {

/*           determine the levenberg-marquardt parameter. */

            __cminpack_func__(lmpar)(n, fjac, ldfjac, ipvt, diag, qtf, delta,
                  &par, wa1, wa2, wa3, wa4);

/*           store the direction p and x + p. calculate the norm of p. */

            for (j = 0; j < n; ++j) {
                wa1[j] = -wa1[j];
                wa2[j] = x[j] + wa1[j];
                wa3[j] = diag[j] * wa1[j];
            }
            pnorm = __cminpack_func__(enorm)(n, wa3);

/*           on the first iteration, adjust the initial step bound. */

            if (iter == 1) {
                delta = min(delta,pnorm);
            }

/*           evaluate the function at x + p and calculate its norm. */

            iflag = fcnder_mn(p, m, n, wa2, wa4, fjac, ldfjac, 1);
            ++(*nfev);
            if (iflag < 0) {
                goto TERMINATE;
            }
            fnorm1 = __cminpack_func__(enorm)(m, wa4);

/*           compute the scaled actual reduction. */

            actred = -1.;
            if (p1 * fnorm1 < fnorm) {
                /* Computing 2nd power */
                d1 = fnorm1 / fnorm;
                actred = 1 - d1 * d1;
            }

/*           compute the scaled predicted reduction and */
/*           the scaled directional derivative. */

            for (j = 0; j < n; ++j) {
                wa3[j] = 0.;
                l = ipvt[j]-1;
                temp = wa1[l];
                for (i = 0; i <= j; ++i) {
                    wa3[i] += fjac[i + j * ldfjac] * temp;
                }
            }
            temp1 = __cminpack_func__(enorm)(n, wa3) / fnorm;
            temp2 = (sqrt(par) * pnorm) / fnorm;
            prered = temp1 * temp1 + temp2 * temp2 / p5;
            dirder = -(temp1 * temp1 + temp2 * temp2);

/*           compute the ratio of the actual to the predicted */
/*           reduction. */

            ratio = 0.;
            if (prered != 0.) {
                ratio = actred / prered;
            }

/*           update the step bound. */

            if (ratio <= p25) {
                if (actred >= 0.) {
                    temp = p5;
                } else {
                    temp = p5 * dirder / (dirder + p5 * actred);
                }
                if (p1 * fnorm1 >= fnorm || temp < p1) {
                    temp = p1;
                }
                /* Computing MIN */
                d1 = pnorm / p1;
                delta = temp * min(delta,d1);
                par /= temp;
            } else {
                if (par == 0. || ratio >= p75) {
                    delta = pnorm / p5;
                    par = p5 * par;
                }
            }

/*           test for successful iteration. */

            if (ratio >= p0001) {

/*           successful iteration. update x, fvec, and their norms. */

                for (j = 0; j < n; ++j) {
                    x[j] = wa2[j];
                    wa2[j] = diag[j] * x[j];
                }
                for (i = 0; i < m; ++i) {
                    fvec[i] = wa4[i];
                }
                xnorm = __cminpack_func__(enorm)(n, wa2);
                fnorm = fnorm1;
                ++iter;
            }

/*           tests for convergence. */

            if (fabs(actred) <= ftol && prered <= ftol && p5 * ratio <= 1.) {
                info = 1;
            }
            if (delta <= xtol * xnorm) {
                info = 2;
            }
            if (fabs(actred) <= ftol && prered <= ftol && p5 * ratio <= 1. && info == 2) {
                info = 3;
            }
            if (info != 0) {
                goto TERMINATE;
            }

/*           tests for termination and stringent tolerances. */

            if (*nfev >= maxfev) {
                info = 5;
            }
            if (fabs(actred) <= epsmch && prered <= epsmch && p5 * ratio <= 1.) {
                info = 6;
            }
            if (delta <= epsmch * xnorm) {
                info = 7;
            }
            if (gnorm <= epsmch) {
                info = 8;
            }
            if (info != 0) {
                goto TERMINATE;
            }

/*           end of the inner loop. repeat if iteration unsuccessful. */

        } while (ratio < p0001);

/*        end of the outer loop. */

    }
TERMINATE:

/*     termination, either normal or user imposed. */

    if (iflag < 0) {
	info = iflag;
    }
    if (nprint > 0) {
	fcnder_mn(p, m, n, x, fvec, fjac, ldfjac, 0);
    }
    return info;

/*     last card of subroutine lmder. */

}